

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall
QToolBarAreaLayoutInfo::moveToolBar(QToolBarAreaLayoutInfo *this,QToolBar *toolbar,int pos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  qsizetype qVar5;
  reference pQVar6;
  reference pQVar7;
  undefined4 extraout_var;
  reference pQVar8;
  int *piVar9;
  int in_EDX;
  long in_RSI;
  QList<QToolBarAreaLayoutLine> *in_RDI;
  long in_FS_OFFSET;
  int margin;
  int minPreferredSize;
  QToolBarAreaLayoutItem *item_1;
  int l_1;
  int extra;
  QToolBarAreaLayoutItem *item;
  int l;
  QToolBarAreaLayoutItem *previous;
  int newPos;
  QToolBarAreaLayoutItem *current;
  int k;
  int previousIndex;
  QToolBarAreaLayoutLine *line;
  int j;
  int diff;
  int maxPos;
  int minPos;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  Orientation in_stack_ffffffffffffff24;
  Orientation o;
  undefined4 in_stack_ffffffffffffff28;
  Orientation in_stack_ffffffffffffff2c;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  int local_98;
  int local_94;
  int local_84;
  int local_74;
  int local_68;
  int local_64;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_28;
  QSize local_24;
  QSize local_1c;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  if (((ulong)in_RDI[2].d.d & 1) != 0) {
    fitLayout((QToolBarAreaLayoutInfo *)
              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  *(undefined1 *)&in_RDI[2].d.d = 1;
  if ((int)in_RDI[1].d.size == 2) {
    iVar2 = QRect::top((QRect *)0x6f164d);
    local_c = local_c - iVar2;
  }
  iVar2 = 0;
  do {
    lVar4 = (long)iVar2;
    qVar5 = QList<QToolBarAreaLayoutLine>::size(in_RDI);
    if (qVar5 <= lVar4) {
LAB_006f1b43:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    pQVar6 = QList<QToolBarAreaLayoutLine>::operator[]
                       ((QList<QToolBarAreaLayoutLine> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_64 = -1;
    local_10 = 0;
    for (local_68 = 0; qVar5 = QList<QToolBarAreaLayoutItem>::size(&pQVar6->toolBarItems),
        local_68 < qVar5; local_68 = local_68 + 1) {
      pQVar7 = QList<QToolBarAreaLayoutItem>::operator[]
                         ((QList<QToolBarAreaLayoutItem> *)
                          CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      iVar3 = (*pQVar7->widgetItem->_vptr_QLayoutItem[0xd])();
      if (CONCAT44(extraout_var,iVar3) == in_RSI) {
        if (-1 < local_64) {
          pQVar8 = QList<QToolBarAreaLayoutItem>::operator[]
                             ((QList<QToolBarAreaLayoutItem> *)
                              CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          if (local_c < pQVar7->pos) {
            piVar9 = qMax<int>(&local_c,&local_10);
            local_74 = *piVar9;
          }
          else {
            in_stack_ffffffffffffff3c = (undefined4)in_RDI[1].d.size;
            local_1c = QRect::size((QRect *)in_stack_ffffffffffffff30);
            local_14 = pick(in_stack_ffffffffffffff24,
                            (QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            local_84 = local_68;
            while( true ) {
              in_stack_ffffffffffffff30 = (QToolBarAreaLayoutItem *)(long)local_84;
              qVar5 = QList<QToolBarAreaLayoutItem>::size(&pQVar6->toolBarItems);
              if (qVar5 <= (long)in_stack_ffffffffffffff30) break;
              QList<QToolBarAreaLayoutItem>::at
                        ((QList<QToolBarAreaLayoutItem> *)
                         CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
              bVar1 = QToolBarAreaLayoutItem::skip
                                ((QToolBarAreaLayoutItem *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
              if (!bVar1) {
                in_stack_ffffffffffffff2c = (Orientation)in_RDI[1].d.size;
                local_24 = QToolBarAreaLayoutItem::minimumSize
                                     ((QToolBarAreaLayoutItem *)
                                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
                ;
                iVar2 = pick(in_stack_ffffffffffffff24,
                             (QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
                ;
                local_14 = local_14 - iVar2;
              }
              local_84 = local_84 + 1;
            }
            piVar9 = qMin<int>(&local_c,&local_14);
            local_74 = *piVar9;
          }
          local_94 = local_74 - pQVar7->pos;
          o = (Orientation)in_RDI[1].d.size;
          QToolBarAreaLayoutItem::sizeHint
                    ((QToolBarAreaLayoutItem *)CONCAT44(o,in_stack_ffffffffffffff20));
          local_28 = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          local_28 = local_28 - (pQVar8->size + local_94);
          iVar2 = qAbs<int>(&local_28);
          iVar3 = QApplication::startDragDistance();
          if (iVar2 < iVar3) {
            local_94 = local_28 + local_94;
          }
          QToolBarAreaLayoutItem::extendSize
                    ((QToolBarAreaLayoutItem *)
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (int)in_stack_ffffffffffffff30);
          if (local_94 < 0) {
            local_94 = -local_94;
            for (local_98 = local_64; -1 < local_98; local_98 = local_98 + -1) {
              pQVar7 = QList<QToolBarAreaLayoutItem>::operator[]
                                 ((QList<QToolBarAreaLayoutItem> *)
                                  CONCAT44(o,in_stack_ffffffffffffff20),
                                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
              bVar1 = QToolBarAreaLayoutItem::skip
                                ((QToolBarAreaLayoutItem *)CONCAT44(in_stack_ffffffffffffff2c,iVar2)
                                );
              if (!bVar1) {
                in_stack_ffffffffffffff20 = (undefined4)in_RDI[1].d.size;
                QToolBarAreaLayoutItem::minimumSize
                          ((QToolBarAreaLayoutItem *)CONCAT44(o,in_stack_ffffffffffffff20));
                iVar3 = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18
                                                ));
                iVar3 = pQVar7->size - iVar3;
                if (iVar3 < local_94) {
                  QToolBarAreaLayoutItem::resize
                            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                             (int)((ulong)lVar4 >> 0x20));
                  local_94 = local_94 - iVar3;
                }
                else {
                  QToolBarAreaLayoutItem::extendSize
                            ((QToolBarAreaLayoutItem *)
                             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             (Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                             (int)in_stack_ffffffffffffff30);
                  local_94 = 0;
                }
              }
            }
          }
          else {
            QToolBarAreaLayoutItem::extendSize
                      ((QToolBarAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (Orientation)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (int)in_stack_ffffffffffffff30);
          }
        }
        goto LAB_006f1b43;
      }
      bVar1 = QToolBarAreaLayoutItem::skip
                        ((QToolBarAreaLayoutItem *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (!bVar1) {
        local_64 = local_68;
        in_stack_ffffffffffffff1c = (undefined4)in_RDI[1].d.size;
        QToolBarAreaLayoutItem::minimumSize
                  ((QToolBarAreaLayoutItem *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        iVar3 = pick(in_stack_ffffffffffffff24,
                     (QSize *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        local_10 = iVar3 + local_10;
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void QToolBarAreaLayoutInfo::moveToolBar(QToolBar *toolbar, int pos)
{
    if (dirty)
        fitLayout();

    dirty = true;

    if (o == Qt::Vertical)
        pos -= rect.top();

    //here we actually update the preferredSize for the line containing the toolbar so that we move it
    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        int previousIndex = -1;
        int minPos = 0;
        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            QToolBarAreaLayoutItem &current = line.toolBarItems[k];
            if (current.widgetItem->widget() == toolbar) {
                int newPos = current.pos;

                if (previousIndex >= 0) {
                    QToolBarAreaLayoutItem &previous = line.toolBarItems[previousIndex];
                    if (pos < current.pos) {
                        newPos = qMax(pos, minPos);
                    } else {
                        //we check the max value for the position (until everything at the right is "compressed")
                        int maxPos = pick(o, rect.size());
                        for(int l = k; l < line.toolBarItems.size(); ++l) {
                            const QToolBarAreaLayoutItem &item = line.toolBarItems.at(l);
                            if (!item.skip()) {
                                maxPos -= pick(o, item.minimumSize());
                            }
                        }
                        newPos = qMin(pos, maxPos);
                    }

                    //extra is the number of pixels to add to the previous toolbar
                    int extra = newPos - current.pos;

                    //we check if the previous is near its size hint
                    //in which case we try to stick to it
                    const int diff = pick(o, previous.sizeHint()) - (previous.size + extra);
                    if (qAbs(diff) < QApplication::startDragDistance()) {
                        //we stick to the default place and size
                        extra += diff;
                    }

                    //update for the current item
                    current.extendSize(line.o, -extra);

                    if (extra >= 0) {
                        previous.extendSize(line.o, extra);
                    } else {
                        //we need to push the toolbars on the left starting with previous
                        extra = -extra; // we just need to know the number of pixels
                        ///at this point we need to get extra pixels from the toolbars at the left
                        for(int l = previousIndex; l >=0; --l) {
                            QToolBarAreaLayoutItem &item = line.toolBarItems[l];
                            if (!item.skip()) {
                                const int minPreferredSize = pick(o, item.minimumSize());
                                const int margin =  item.size - minPreferredSize;
                                if (margin < extra) {
                                    item.resize(line.o, minPreferredSize);
                                    extra -= margin;
                                } else {
                                    item.extendSize(line.o, -extra);
                                    extra = 0;
                                }
                            }
                        }
                        Q_ASSERT(extra == 0);
                    }
                } else {
                    //the item is the first one, it should be at position 0
                }

                return;

            } else if (!current.skip()) {
                previousIndex = k;
                minPos += pick(o, current.minimumSize());
            }
        }
    }
}